

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void resize(lua_State *L,Table *t,int nasize,int nhsize)

{
  byte bVar1;
  int iVar2;
  Node *block;
  uint uVar3;
  size_t nsize;
  TValue *pTVar4;
  TValue *pTVar5;
  long lVar6;
  TValue *o2;
  long lVar7;
  Node *pNVar8;
  int key;
  bool bVar9;
  
  iVar2 = t->sizearray;
  bVar1 = t->lsizenode;
  block = t->node;
  if (iVar2 < nasize) {
    setarrayvector(L,t,nasize);
  }
  setnodevector(L,t,nhsize);
  if (nasize < iVar2) {
    t->sizearray = nasize;
    lVar7 = (long)iVar2 - (long)nasize;
    key = nasize + 1;
    nsize = (long)nasize * 0x10;
    lVar6 = nsize + 8;
    while (bVar9 = lVar7 != 0, lVar7 = lVar7 + -1, bVar9) {
      pTVar5 = t->array;
      if (*(int *)((long)&pTVar5->value + lVar6) != 0) {
        pTVar4 = luaH_setnum(L,t,key);
        pTVar4->value = *(Value *)((long)pTVar5 + lVar6 + -8);
        pTVar4->tt = *(int *)((long)&pTVar5->value + lVar6);
      }
      key = key + 1;
      lVar6 = lVar6 + 0x10;
    }
    if (nasize < -1) {
      luaM_toobig(L);
    }
    pTVar5 = (TValue *)luaM_realloc_(L,t->array,(long)iVar2 << 4,nsize);
    t->array = pTVar5;
  }
  lVar6 = 1L << (bVar1 & 0x3f);
  while( true ) {
    lVar6 = lVar6 + -1;
    if ((int)(uint)lVar6 < 0) break;
    uVar3 = (uint)lVar6 & 0x7fffffff;
    if (block[uVar3].i_val.tt != 0) {
      pNVar8 = block + uVar3;
      pTVar5 = luaH_set(L,t,&(pNVar8->i_key).tvk);
      pTVar5->value = (pNVar8->i_val).value;
      pTVar5->tt = (pNVar8->i_val).tt;
    }
  }
  if (block != &dummynode_) {
    luaM_realloc_(L,block,0x28L << (bVar1 & 0x3f),0);
    return;
  }
  return;
}

Assistant:

static void resize(lua_State*L,Table*t,int nasize,int nhsize){
int i;
int oldasize=t->sizearray;
int oldhsize=t->lsizenode;
Node*nold=t->node;
if(nasize>oldasize)
setarrayvector(L,t,nasize);
setnodevector(L,t,nhsize);
if(nasize<oldasize){
t->sizearray=nasize;
for(i=nasize;i<oldasize;i++){
if(!ttisnil(&t->array[i]))
setobj(L,luaH_setnum(L,t,i+1),&t->array[i]);
}
luaM_reallocvector(L,t->array,oldasize,nasize,TValue);
}
for(i=twoto(oldhsize)-1;i>=0;i--){
Node*old=nold+i;
if(!ttisnil(gval(old)))
setobj(L,luaH_set(L,t,key2tval(old)),gval(old));
}
if(nold!=(&dummynode_))
luaM_freearray(L,nold,twoto(oldhsize),Node);
}